

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool CoreML::Specification::NeuralNetworkMultiArrayShapeMapping_Parse
               (ConstStringParam name,NeuralNetworkMultiArrayShapeMapping *value)

{
  pointer size;
  char *size_00;
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  NeuralNetworkMultiArrayShapeMapping local_1c;
  
  size = (name->_M_dataplus)._M_p;
  size_00 = (char *)name->_M_string_length;
  if ((long)size_00 < 0) {
    google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)size_00,"string length exceeds max size");
  }
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = size_00;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)NeuralNetworkMultiArrayShapeMapping_entries,(EnumEntry *)0x2,
                     (size_t)size,name_00,in_R9);
  if (bVar1) {
    *value = local_1c;
  }
  return bVar1;
}

Assistant:

bool NeuralNetworkMultiArrayShapeMapping_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, NeuralNetworkMultiArrayShapeMapping* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      NeuralNetworkMultiArrayShapeMapping_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<NeuralNetworkMultiArrayShapeMapping>(int_value);
  }
  return success;
}